

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O0

void __thiscall
FZFile::parse(FZFile *this,vector<char,_std::allocator<char>_> *buf,array<unsigned_int,_44UL> *fzkey
             )

{
  BRDPartMountingSide BVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  void *pvVar5;
  reference ppcVar6;
  byte *pbVar7;
  mapped_type *pmVar8;
  size_t sVar9;
  size_type sVar10;
  reference ppcVar11;
  array<unsigned_int,_44UL> *paVar12;
  reference pvVar13;
  reference pvVar14;
  void *in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  size_type i_1;
  iterator iter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *partname;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  FZPartDesc *pdesc_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<FZPartDesc,_std::allocator<FZPartDesc>_> *__range1_1;
  FZPartDesc pdesc;
  char *s_1;
  char *p_1;
  char *line_1;
  size_t i;
  char *loc;
  double posy_1;
  double posx_1;
  BRDNail nail;
  double radius;
  double posy;
  double posx;
  bool name_is_pin_position_id;
  char *name;
  char *part_1;
  BRDPin pin;
  char *smirror;
  BRDPart part;
  char *s;
  char *p;
  char *line;
  iterator __end1;
  iterator __begin1;
  vector<char_*,_std::allocator<char_*>_> *__range1;
  vector<char_*,_std::allocator<char_*>_> lines_descr;
  vector<char_*,_std::allocator<char_*>_> lines_content;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  parts_id;
  int current_block;
  char *content;
  char *descr;
  size_t descr_size;
  size_t content_size;
  uint8_t s2;
  uint8_t s1;
  char *arena_end;
  char *arena;
  size_t file_buf_size;
  float multiplier;
  char *saved_locale;
  size_type buffer_size;
  key_type *in_stack_ffffffffffffec68;
  vector<BRDPart,_std::allocator<BRDPart>_> *this_00;
  undefined4 in_stack_ffffffffffffec70;
  uint in_stack_ffffffffffffec74;
  value_type *in_stack_ffffffffffffec78;
  BRDPart *in_stack_ffffffffffffec80;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffec88;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffec90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffecb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined8 in_stack_ffffffffffffecb8;
  size_t in_stack_ffffffffffffecd0;
  char *in_stack_ffffffffffffecd8;
  ulong uVar15;
  FZFile *in_stack_ffffffffffffece0;
  size_t *in_stack_ffffffffffffece8;
  size_t in_stack_ffffffffffffecf0;
  char *in_stack_ffffffffffffecf8;
  bool local_12d2;
  bool local_12d1;
  array<unsigned_int,_44UL> *in_stack_ffffffffffffed38;
  FZFile *in_stack_ffffffffffffed40;
  anon_class_16_2_d7082a65 *in_stack_ffffffffffffedc0;
  string local_11e8 [32];
  string local_11c8 [32];
  array<unsigned_int,_44UL> *in_stack_ffffffffffffee58;
  array<unsigned_int,_44UL> *__lhs;
  array<unsigned_int,_44UL> *fzkey_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_11a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_1198;
  reference local_1190;
  string *in_stack_ffffffffffffee78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1178;
  reference local_1170;
  FZPartDesc *local_1168;
  __normal_iterator<FZPartDesc_*,_std::vector<FZPartDesc,_std::allocator<FZPartDesc>_>_> local_1160;
  long *local_1158;
  byte **local_1150;
  undefined1 *local_1148;
  long *local_1140;
  undefined1 **local_1138;
  undefined1 local_1129 [9];
  undefined1 *local_1120;
  undefined8 local_1118;
  undefined1 **local_1110;
  string local_1108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e8;
  byte **local_10c0;
  undefined1 *local_10b8;
  long *local_10b0;
  undefined1 **local_10a8;
  byte **local_10a0;
  undefined1 *local_1098;
  long *local_1090;
  undefined1 **local_1088;
  char *local_1080;
  char *local_1078;
  uint local_1070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1050;
  undefined1 local_1048 [8];
  byte *local_1040;
  byte *local_1038;
  ulong local_1030;
  byte **local_1028;
  byte **local_1020;
  undefined1 *local_1018;
  long *local_1010;
  undefined1 **local_1008;
  char *local_1000;
  byte **local_ff8;
  double local_ff0;
  byte **local_fe8;
  double local_fe0;
  byte **local_fd8;
  undefined1 *local_fd0;
  long *local_fc8;
  undefined1 **local_fc0;
  byte **local_fb8;
  byte **local_fb0;
  undefined1 *local_fa8;
  long *local_fa0;
  undefined1 **local_f98;
  byte **local_f90;
  undefined1 *local_f88;
  long *local_f80;
  undefined1 **local_f78;
  int local_f6c;
  int local_f68;
  undefined4 local_f64;
  char *local_f60;
  byte **local_f58;
  double local_f50;
  byte **local_f48;
  byte **local_f38;
  double local_f30;
  byte **local_f28;
  double local_f20;
  bool local_f11;
  byte **local_f10;
  undefined1 *local_f08;
  long *local_f00;
  undefined1 **local_ef8;
  char *local_ef0;
  byte **local_ee8;
  undefined1 *local_ee0;
  long *local_ed8;
  undefined1 **local_ed0;
  allocator<char> local_ec1;
  string local_ec0 [32];
  byte **local_ea0;
  undefined1 *local_e98;
  long *local_e90;
  undefined1 **local_e88;
  char *local_e80;
  byte **local_e78;
  undefined1 *local_e70;
  long *local_e68;
  undefined1 **local_e60;
  int local_e58;
  int local_e54;
  uint local_e50;
  mapped_type local_e4c;
  undefined4 local_e48;
  char *local_e40;
  double local_e38;
  char *local_e30;
  char *local_e28;
  allocator<char> local_e19;
  string local_e18 [32];
  byte **local_df8;
  undefined1 *local_df0;
  long *local_de8;
  undefined1 **local_de0;
  byte **local_dd8;
  undefined1 *local_dd0;
  long *local_dc8;
  undefined1 **local_dc0;
  char *local_db8;
  byte **local_db0;
  undefined1 *local_da8;
  long *local_da0;
  undefined1 **local_d98;
  byte **local_d90;
  undefined1 *local_d88;
  long *local_d80;
  undefined1 **local_d78;
  byte **local_d70;
  undefined1 *local_d68;
  long *local_d60;
  undefined1 **local_d58;
  char *local_d50;
  undefined4 local_d28;
  undefined4 local_d24;
  undefined4 local_d20;
  undefined1 local_d08 [8];
  byte *local_d00;
  byte *local_cf8;
  char **local_cf0;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_ce8;
  undefined1 *local_ce0;
  char local_cd2 [2];
  vector<char_*,_std::allocator<char_*>_> local_cd0;
  undefined1 local_cb8 [84];
  int local_c64;
  string local_c60 [39];
  allocator<char> local_c39;
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [32];
  string local_bd8 [32];
  string local_bb8 [32];
  string local_b98 [32];
  string local_b78 [32];
  string local_b58 [32];
  string local_b38 [39];
  allocator<char> local_b11;
  string local_b10 [32];
  string local_af0 [32];
  string local_ad0 [32];
  string local_ab0 [32];
  string local_a90 [32];
  string local_a70 [32];
  string local_a50 [32];
  string local_a30 [32];
  string local_a10 [39];
  allocator<char> local_9e9;
  string local_9e8 [32];
  string local_9c8 [32];
  string local_9a8 [32];
  string local_988 [32];
  string local_968 [32];
  string local_948 [32];
  string local_928 [32];
  string local_908 [32];
  string local_8e8 [39];
  allocator<char> local_8c1;
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [39];
  allocator<char> local_799;
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [39];
  allocator<char> local_671;
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [39];
  allocator<char> local_549;
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [39];
  allocator<char> local_421;
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  char *local_320;
  char *local_318;
  size_t local_310;
  size_t local_308;
  char local_2fa;
  char local_2f9;
  undefined1 *local_2f8;
  long local_2f0;
  char *local_2e8;
  char *local_2e0;
  string local_2d8 [39];
  allocator<char> local_2b1;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  size_t local_1b0;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [48];
  string local_50 [36];
  float local_2c;
  char *local_28;
  size_type local_20;
  void *local_18;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffecb8 >> 0x20);
  local_18 = in_RDX;
  local_20 = std::vector<char,_std::allocator<char>_>::size(in_RSI);
  local_2c = 1.0;
  local_28 = setlocale(1,"C");
  bVar2 = check_fz_key<44ul>(in_stack_ffffffffffffed40,in_stack_ffffffffffffed38);
  if (bVar2) {
    memcpy(in_RDI + 0x1b,local_18,0xb0);
  }
  else {
    bVar2 = check_fz_key<44ul>(in_stack_ffffffffffffed40,in_stack_ffffffffffffed38);
    if (!bVar2) {
      *(undefined1 *)(in_RDI + 0x12) = 0;
      (**(code **)(*in_RDI + 0x18))();
      std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_50);
      std::__cxx11::string::~string(local_50);
      fz_key_to_string<44ul>(in_stack_ffffffffffffee58);
      std::__cxx11::string::operator+=((string *)(in_RDI + 0x13),local_80);
      std::__cxx11::string::~string(local_80);
      return;
    }
  }
  if (local_20 < 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffecb0,(char *)in_stack_ffffffffffffeca8,
               (allocator<char> *)in_stack_ffffffffffffeca0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffec78,
                   (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
    std::__cxx11::to_string(iVar3);
    std::operator+(in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffec78,
                   (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffec78,
                   (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffec78,
                   (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffec78,
                   (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffec78,
                   (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
    std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_a0);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator(&local_181);
    uVar4 = std::__cxx11::string::c_str();
    SDL_LogError(1,"%s",uVar4);
  }
  else {
    local_1b0 = (local_20 + 1) * 3;
    pvVar5 = calloc(1,local_1b0);
    in_RDI[0x17] = (long)pvVar5;
    if (in_RDI[0x17] == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffecb0,(char *)in_stack_ffffffffffffeca8,
                 (allocator<char> *)in_stack_ffffffffffffeca0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec78,
                     (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
      std::__cxx11::to_string(iVar3);
      std::operator+(in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec78,
                     (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec78,
                     (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec78,
                     (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec78,
                     (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec78,
                     (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
      std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_1d0);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::string::~string(local_230);
      std::__cxx11::string::~string(local_250);
      std::__cxx11::string::~string(local_270);
      std::__cxx11::string::~string(local_2d8);
      std::__cxx11::string::~string(local_290);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      uVar4 = std::__cxx11::string::c_str();
      SDL_LogError(1,"%s",uVar4);
    }
    else {
      local_2e0 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                    ((vector<char,_std::allocator<char>_> *)
                                     in_stack_ffffffffffffec68);
      local_2e8 = (char *)std::vector<char,_std::allocator<char>_>::end
                                    ((vector<char,_std::allocator<char>_> *)
                                     in_stack_ffffffffffffec68);
      std::copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char*>
                (in_stack_ffffffffffffec90,in_stack_ffffffffffffec88,
                 (char *)in_stack_ffffffffffffec80);
      *(undefined1 *)(in_RDI[0x17] + local_20) = 0;
      local_2f0 = in_RDI[0x17] + local_20 + 1;
      local_2f8 = (undefined1 *)(in_RDI[0x17] + local_1b0 + -1);
      *local_2f8 = 0;
      local_2f9 = *(char *)(in_RDI[0x17] + 4);
      local_2fa = *(char *)(in_RDI[0x17] + 5);
      if ((local_2f9 != 'x') || ((local_2fa != -100 && (local_2fa != -0x26)))) {
        decode(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd0);
      }
      local_308 = 0;
      local_310 = 0;
      local_320 = split((char *)in_RDI[0x17],local_20,&local_308,&local_318,&local_310);
      if (local_320 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffecb0,(char *)in_stack_ffffffffffffeca8,
                   (allocator<char> *)in_stack_ffffffffffffeca0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec78,
                       (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
        std::__cxx11::to_string(iVar3);
        std::operator+(in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec78,
                       (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec78,
                       (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec78,
                       (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec78,
                       (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec78,
                       (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
        std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_340);
        std::__cxx11::string::~string(local_340);
        std::__cxx11::string::~string(local_360);
        std::__cxx11::string::~string(local_380);
        std::__cxx11::string::~string(local_3a0);
        std::__cxx11::string::~string(local_3c0);
        std::__cxx11::string::~string(local_3e0);
        std::__cxx11::string::~string(local_448);
        std::__cxx11::string::~string(local_400);
        std::__cxx11::string::~string(local_420);
        std::allocator<char>::~allocator(&local_421);
        uVar4 = std::__cxx11::string::c_str();
        SDL_LogError(1,"%s",uVar4);
      }
      else if (local_308 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffecb0,(char *)in_stack_ffffffffffffeca8,
                   (allocator<char> *)in_stack_ffffffffffffeca0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec78,
                       (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
        std::__cxx11::to_string(iVar3);
        std::operator+(in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec78,
                       (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec78,
                       (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec78,
                       (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec78,
                       (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec78,
                       (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
        std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_468);
        std::__cxx11::string::~string(local_468);
        std::__cxx11::string::~string(local_488);
        std::__cxx11::string::~string(local_4a8);
        std::__cxx11::string::~string(local_4c8);
        std::__cxx11::string::~string(local_4e8);
        std::__cxx11::string::~string(local_508);
        std::__cxx11::string::~string(local_570);
        std::__cxx11::string::~string(local_528);
        std::__cxx11::string::~string(local_548);
        std::allocator<char>::~allocator(&local_549);
        uVar4 = std::__cxx11::string::c_str();
        SDL_LogError(1,"%s",uVar4);
      }
      else {
        local_320 = decompress(in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0,
                               in_stack_ffffffffffffece8);
        if (local_320 == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffecb0,(char *)in_stack_ffffffffffffeca8,
                     (allocator<char> *)in_stack_ffffffffffffeca0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::__cxx11::to_string(iVar3);
          std::operator+(in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_590);
          std::__cxx11::string::~string(local_590);
          std::__cxx11::string::~string(local_5b0);
          std::__cxx11::string::~string(local_5d0);
          std::__cxx11::string::~string(local_5f0);
          std::__cxx11::string::~string(local_610);
          std::__cxx11::string::~string(local_630);
          std::__cxx11::string::~string(local_698);
          std::__cxx11::string::~string(local_650);
          std::__cxx11::string::~string(local_670);
          std::allocator<char>::~allocator(&local_671);
          uVar4 = std::__cxx11::string::c_str();
          SDL_LogError(1,"%s",uVar4);
        }
        else if (local_308 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffecb0,(char *)in_stack_ffffffffffffeca8,
                     (allocator<char> *)in_stack_ffffffffffffeca0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::__cxx11::to_string(iVar3);
          std::operator+(in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_6b8);
          std::__cxx11::string::~string(local_6b8);
          std::__cxx11::string::~string(local_6d8);
          std::__cxx11::string::~string(local_6f8);
          std::__cxx11::string::~string(local_718);
          std::__cxx11::string::~string(local_738);
          std::__cxx11::string::~string(local_758);
          std::__cxx11::string::~string(local_7c0);
          std::__cxx11::string::~string(local_778);
          std::__cxx11::string::~string(local_798);
          std::allocator<char>::~allocator(&local_799);
          uVar4 = std::__cxx11::string::c_str();
          SDL_LogError(1,"%s",uVar4);
        }
        else if (local_320 == local_318) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffecb0,(char *)in_stack_ffffffffffffeca8,
                     (allocator<char> *)in_stack_ffffffffffffeca0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::__cxx11::to_string(iVar3);
          std::operator+(in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_7e0);
          std::__cxx11::string::~string(local_7e0);
          std::__cxx11::string::~string(local_800);
          std::__cxx11::string::~string(local_820);
          std::__cxx11::string::~string(local_840);
          std::__cxx11::string::~string(local_860);
          std::__cxx11::string::~string(local_880);
          std::__cxx11::string::~string(local_8e8);
          std::__cxx11::string::~string(local_8a0);
          std::__cxx11::string::~string(local_8c0);
          std::allocator<char>::~allocator(&local_8c1);
          uVar4 = std::__cxx11::string::c_str();
          SDL_LogError(1,"%s",uVar4);
        }
        else if (local_310 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffecb0,(char *)in_stack_ffffffffffffeca8,
                     (allocator<char> *)in_stack_ffffffffffffeca0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::__cxx11::to_string(iVar3);
          std::operator+(in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec78,
                         (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
          std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_908);
          std::__cxx11::string::~string(local_908);
          std::__cxx11::string::~string(local_928);
          std::__cxx11::string::~string(local_948);
          std::__cxx11::string::~string(local_968);
          std::__cxx11::string::~string(local_988);
          std::__cxx11::string::~string(local_9a8);
          std::__cxx11::string::~string(local_a10);
          std::__cxx11::string::~string(local_9c8);
          std::__cxx11::string::~string(local_9e8);
          std::allocator<char>::~allocator(&local_9e9);
          uVar4 = std::__cxx11::string::c_str();
          SDL_LogError(1,"%s",uVar4);
        }
        else {
          local_318 = decompress(in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0,
                                 in_stack_ffffffffffffece8);
          if (local_318 == (char *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffecb0,(char *)in_stack_ffffffffffffeca8,
                       (allocator<char> *)in_stack_ffffffffffffeca0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec78,
                           (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            std::__cxx11::to_string(iVar3);
            std::operator+(in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec78,
                           (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec78,
                           (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec78,
                           (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec78,
                           (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec78,
                           (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_a30);
            std::__cxx11::string::~string(local_a30);
            std::__cxx11::string::~string(local_a50);
            std::__cxx11::string::~string(local_a70);
            std::__cxx11::string::~string(local_a90);
            std::__cxx11::string::~string(local_ab0);
            std::__cxx11::string::~string(local_ad0);
            std::__cxx11::string::~string(local_b38);
            std::__cxx11::string::~string(local_af0);
            std::__cxx11::string::~string(local_b10);
            std::allocator<char>::~allocator(&local_b11);
            uVar4 = std::__cxx11::string::c_str();
            SDL_LogError(1,"%s",uVar4);
          }
          else if (local_310 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffecb0,(char *)in_stack_ffffffffffffeca8,
                       (allocator<char> *)in_stack_ffffffffffffeca0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec78,
                           (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            std::__cxx11::to_string(iVar3);
            std::operator+(in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec78,
                           (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec78,
                           (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec78,
                           (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec78,
                           (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec78,
                           (char *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_b58);
            std::__cxx11::string::~string(local_b58);
            std::__cxx11::string::~string(local_b78);
            std::__cxx11::string::~string(local_b98);
            std::__cxx11::string::~string(local_bb8);
            std::__cxx11::string::~string(local_bd8);
            std::__cxx11::string::~string(local_bf8);
            std::__cxx11::string::~string(local_c60);
            std::__cxx11::string::~string(local_c18);
            std::__cxx11::string::~string(local_c38);
            std::allocator<char>::~allocator(&local_c39);
            uVar4 = std::__cxx11::string::c_str();
            SDL_LogError(1,"%s",uVar4);
          }
          else {
            local_c64 = 0;
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)0x181dbb);
            std::vector<char_*,_std::allocator<char_*>_>::vector
                      ((vector<char_*,_std::allocator<char_*>_> *)0x181dd0);
            stringfile(in_stack_ffffffffffffec90._M_current,
                       (vector<char_*,_std::allocator<char_*>_> *)
                       in_stack_ffffffffffffec88._M_current);
            std::vector<char_*,_std::allocator<char_*>_>::vector
                      ((vector<char_*,_std::allocator<char_*>_> *)0x181dfc);
            stringfile(in_stack_ffffffffffffec90._M_current,
                       (vector<char_*,_std::allocator<char_*>_> *)
                       in_stack_ffffffffffffec88._M_current);
            local_cd2[1] = 0x2c;
            local_cd2[0] = '.';
            std::replace<char*,char>(local_320,local_320 + local_308,local_cd2 + 1,local_cd2);
            local_ce0 = local_cb8;
            local_ce8._M_current =
                 (char **)std::vector<char_*,_std::allocator<char_*>_>::begin
                                    ((vector<char_*,_std::allocator<char_*>_> *)
                                     in_stack_ffffffffffffec68);
            local_cf0 = (char **)std::vector<char_*,_std::allocator<char_*>_>::end
                                           ((vector<char_*,_std::allocator<char_*>_> *)
                                            in_stack_ffffffffffffec68);
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                       *)CONCAT44(in_stack_ffffffffffffec74,
                                                  in_stack_ffffffffffffec70),
                                      (__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                       *)in_stack_ffffffffffffec68), bVar2) {
              ppcVar6 = __gnu_cxx::
                        __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
                        operator*(&local_ce8);
              local_cf8 = (byte *)*ppcVar6;
              while (iVar3 = isspace((uint)*local_cf8), iVar3 != 0) {
                local_cf8 = local_cf8 + 1;
              }
              pbVar7 = local_d00;
              if (*local_cf8 != 0) {
                local_d00 = local_cf8;
                iVar3 = strcmp((char *)local_cf8,"UNIT:millimeters");
                if (iVar3 == 0) {
                  local_2c = 25.4;
                }
                if (*local_cf8 == 0x41) {
                  local_cf8 = local_cf8 + 2;
                  iVar3 = strncmp((char *)local_cf8,"REFDES",6);
                  if (iVar3 == 0) {
                    local_c64 = 1;
                    pbVar7 = local_d00;
                  }
                  else {
                    iVar3 = strncmp((char *)local_cf8,"NET_NAME",8);
                    if (iVar3 == 0) {
                      local_c64 = 2;
                      pbVar7 = local_d00;
                    }
                    else {
                      iVar3 = strncmp((char *)local_cf8,"TESTVIA",7);
                      if (iVar3 == 0) {
                        local_c64 = 3;
                        pbVar7 = local_d00;
                      }
                      else {
                        iVar3 = strncmp((char *)local_cf8,"GRAPHIC_DATA_NAME",0x11);
                        if (iVar3 == 0) {
                          local_c64 = 4;
                          pbVar7 = local_d00;
                        }
                        else {
                          iVar3 = strncmp((char *)local_cf8,"CLASS",5);
                          if (iVar3 == 0) {
                            local_c64 = 5;
                            pbVar7 = local_d00;
                          }
                          else {
                            iVar3 = strncmp((char *)local_cf8,"LOGOInfo",8);
                            if (iVar3 == 0) {
                              local_c64 = 6;
                              pbVar7 = local_d00;
                            }
                            else {
                              iVar3 = strncmp((char *)local_cf8,"UnDrawSym",9);
                              pbVar7 = local_d00;
                              if (iVar3 == 0) {
                                local_c64 = 7;
                              }
                              else {
                                local_c64 = -1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  pbVar7 = local_d00;
                  if (*local_cf8 == 0x53) {
                    pbVar7 = local_d00 + 2;
                    switch(local_c64) {
                    case 1:
                      local_d00 = pbVar7;
                      BRDPart::BRDPart(in_stack_ffffffffffffec80);
                      local_d70 = &local_d00;
                      local_d68 = local_d08;
                      local_d60 = &local_2f0;
                      local_d58 = &local_2f8;
                      local_d50 = parse::anon_class_32_4_fa413470::operator()
                                            ((anon_class_32_4_fa413470 *)
                                             CONCAT44(in_stack_ffffffffffffec74,
                                                      in_stack_ffffffffffffec70));
                      local_d90 = &local_d00;
                      local_d88 = local_d08;
                      local_d80 = &local_2f0;
                      local_d78 = &local_2f8;
                      parse::anon_class_32_4_fa413470::operator()
                                ((anon_class_32_4_fa413470 *)
                                 CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
                      local_db0 = &local_d00;
                      local_da8 = local_d08;
                      local_da0 = &local_2f0;
                      local_d98 = &local_2f8;
                      parse::anon_class_32_4_fa413470::operator()
                                ((anon_class_32_4_fa413470 *)
                                 CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
                      local_dd8 = &local_d00;
                      local_dd0 = local_d08;
                      local_dc8 = &local_2f0;
                      local_dc0 = &local_2f8;
                      local_db8 = parse::anon_class_32_4_fa413470::operator()
                                            ((anon_class_32_4_fa413470 *)
                                             CONCAT44(in_stack_ffffffffffffec74,
                                                      in_stack_ffffffffffffec70));
                      local_df8 = &local_d00;
                      local_df0 = local_d08;
                      local_de8 = &local_2f0;
                      local_de0 = &local_2f8;
                      parse::anon_class_32_4_fa413470::operator()
                                ((anon_class_32_4_fa413470 *)
                                 CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
                      local_d24 = 0;
                      iVar3 = strcmp(local_db8,"YES");
                      if (iVar3 == 0) {
                        local_d28 = 2;
                      }
                      else {
                        local_d28 = 1;
                      }
                      local_d20 = 0;
                      std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                ((vector<BRDPart,_std::allocator<BRDPart>_> *)
                                 in_stack_ffffffffffffec80,in_stack_ffffffffffffec78);
                      sVar10 = std::vector<BRDPart,_std::allocator<BRDPart>_>::size
                                         ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9))
                      ;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_ffffffffffffecb0,(char *)in_stack_ffffffffffffeca8,
                                 (allocator<char> *)in_stack_ffffffffffffeca0);
                      pmVar8 = std::
                               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                             *)CONCAT44(in_stack_ffffffffffffec74,
                                                        in_stack_ffffffffffffec70),
                                            in_stack_ffffffffffffec68);
                      *pmVar8 = (mapped_type)sVar10;
                      std::__cxx11::string::~string(local_e18);
                      std::allocator<char>::~allocator(&local_e19);
                      BRDPart::~BRDPart((BRDPart *)0x18243d);
                      pbVar7 = local_d00;
                      break;
                    case 2:
                      local_d00 = pbVar7;
                      BRDPin::BRDPin((BRDPin *)
                                     CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
                      local_e78 = &local_d00;
                      local_e70 = local_d08;
                      local_e68 = &local_2f0;
                      local_e60 = &local_2f8;
                      local_e40 = parse::anon_class_32_4_fa413470::operator()
                                            ((anon_class_32_4_fa413470 *)
                                             CONCAT44(in_stack_ffffffffffffec74,
                                                      in_stack_ffffffffffffec70));
                      local_ea0 = &local_d00;
                      local_e98 = local_d08;
                      local_e90 = &local_2f0;
                      local_e88 = &local_2f8;
                      local_e80 = parse::anon_class_32_4_fa413470::operator()
                                            ((anon_class_32_4_fa413470 *)
                                             CONCAT44(in_stack_ffffffffffffec74,
                                                      in_stack_ffffffffffffec70));
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_ffffffffffffecb0,(char *)in_stack_ffffffffffffeca8,
                                 (allocator<char> *)in_stack_ffffffffffffeca0);
                      in_stack_ffffffffffffed40 =
                           (FZFile *)
                           std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70),
                                in_stack_ffffffffffffec68);
                      local_e4c = *(mapped_type *)
                                   &(in_stack_ffffffffffffed40->super_BRDFileBase)._vptr_BRDFileBase
                      ;
                      std::__cxx11::string::~string(local_ec0);
                      std::allocator<char>::~allocator(&local_ec1);
                      local_ee8 = &local_d00;
                      local_ee0 = local_d08;
                      local_ed8 = &local_2f0;
                      local_ed0 = &local_2f8;
                      local_e30 = parse::anon_class_32_4_fa413470::operator()
                                            ((anon_class_32_4_fa413470 *)
                                             CONCAT44(in_stack_ffffffffffffec74,
                                                      in_stack_ffffffffffffec70));
                      local_f10 = &local_d00;
                      local_f08 = local_d08;
                      local_f00 = &local_2f0;
                      local_ef8 = &local_2f8;
                      local_ef0 = parse::anon_class_32_4_fa413470::operator()
                                            ((anon_class_32_4_fa413470 *)
                                             CONCAT44(in_stack_ffffffffffffec74,
                                                      in_stack_ffffffffffffec70));
                      sVar9 = strlen(local_e30);
                      local_12d1 = false;
                      if (sVar9 < 2) {
                        local_12d2 = true;
                        if (*local_e30 != '\0') {
                          local_12d2 = *local_e30 == '0';
                        }
                        local_12d1 = local_12d2;
                      }
                      local_f11 = local_12d1;
                      if (local_12d1 != false) {
                        local_e28 = local_ef0;
                      }
                      local_f28 = &local_d00;
                      local_f20 = parse::anon_class_8_1_54a39810::operator()
                                            ((anon_class_8_1_54a39810 *)
                                             CONCAT44(in_stack_ffffffffffffec74,
                                                      in_stack_ffffffffffffec70));
                      local_e58 = (int)(local_f20 * (double)local_2c);
                      local_f38 = &local_d00;
                      local_f30 = parse::anon_class_8_1_54a39810::operator()
                                            ((anon_class_8_1_54a39810 *)
                                             CONCAT44(in_stack_ffffffffffffec74,
                                                      in_stack_ffffffffffffec70));
                      local_e54 = (int)(local_f30 * (double)local_2c);
                      local_f48 = &local_d00;
                      local_e50 = parse::anon_class_16_2_d7082a65::operator()
                                            (in_stack_ffffffffffffedc0);
                      local_f58 = &local_d00;
                      local_f50 = parse::anon_class_8_1_54a39810::operator()
                                            ((anon_class_8_1_54a39810 *)
                                             CONCAT44(in_stack_ffffffffffffec74,
                                                      in_stack_ffffffffffffec70));
                      local_f50 = local_f50 / 100.0;
                      if (local_f50 < 0.5) {
                        local_f50 = 0.5;
                      }
                      local_e38 = local_f50 * (double)local_2c;
                      pvVar14 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                                          ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9)
                                           ,(ulong)(local_e4c - 1));
                      BVar1 = pvVar14->mounting_side;
                      if (BVar1 == Both) {
                        local_e48 = 0;
                      }
                      else if (BVar1 == Bottom) {
                        local_e48 = 1;
                      }
                      else if (BVar1 == Top) {
                        local_e48 = 2;
                      }
                      std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back
                                ((vector<BRDPin,_std::allocator<BRDPin>_> *)
                                 in_stack_ffffffffffffec80,(value_type *)in_stack_ffffffffffffec78);
                      pbVar7 = local_d00;
                      break;
                    case 3:
                      local_d00 = local_d00 + 4;
                      BRDNail::BRDNail((BRDNail *)
                                       CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70)
                                      );
                      local_f90 = &local_d00;
                      local_f88 = local_d08;
                      local_f80 = &local_2f0;
                      local_f78 = &local_2f8;
                      local_f60 = parse::anon_class_32_4_fa413470::operator()
                                            ((anon_class_32_4_fa413470 *)
                                             CONCAT44(in_stack_ffffffffffffec74,
                                                      in_stack_ffffffffffffec70));
                      local_fb0 = &local_d00;
                      local_fa8 = local_d08;
                      local_fa0 = &local_2f0;
                      local_f98 = &local_2f8;
                      parse::anon_class_32_4_fa413470::operator()
                                ((anon_class_32_4_fa413470 *)
                                 CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
                      local_fb8 = &local_d00;
                      parse::anon_class_8_1_54a39810::operator()
                                ((anon_class_8_1_54a39810 *)
                                 CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
                      local_fd8 = &local_d00;
                      local_fd0 = local_d08;
                      local_fc8 = &local_2f0;
                      local_fc0 = &local_2f8;
                      parse::anon_class_32_4_fa413470::operator()
                                ((anon_class_32_4_fa413470 *)
                                 CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
                      local_fe8 = &local_d00;
                      local_fe0 = parse::anon_class_8_1_54a39810::operator()
                                            ((anon_class_8_1_54a39810 *)
                                             CONCAT44(in_stack_ffffffffffffec74,
                                                      in_stack_ffffffffffffec70));
                      local_f6c = (int)(local_fe0 * (double)local_2c);
                      local_ff8 = &local_d00;
                      local_ff0 = parse::anon_class_8_1_54a39810::operator()
                                            ((anon_class_8_1_54a39810 *)
                                             CONCAT44(in_stack_ffffffffffffec74,
                                                      in_stack_ffffffffffffec70));
                      local_f68 = (int)(local_ff0 * (double)local_2c);
                      local_1020 = &local_d00;
                      local_1018 = local_d08;
                      local_1010 = &local_2f0;
                      local_1008 = &local_2f8;
                      local_1000 = parse::anon_class_32_4_fa413470::operator()
                                             ((anon_class_32_4_fa413470 *)
                                              CONCAT44(in_stack_ffffffffffffec74,
                                                       in_stack_ffffffffffffec70));
                      iVar3 = strcmp(local_1000,"T");
                      if (iVar3 == 0) {
                        local_f64 = 2;
                      }
                      else {
                        local_f64 = 1;
                      }
                      local_1028 = &local_d00;
                      parse::anon_class_8_1_54a39810::operator()
                                ((anon_class_8_1_54a39810 *)
                                 CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
                      std::vector<BRDNail,_std::allocator<BRDNail>_>::push_back
                                ((vector<BRDNail,_std::allocator<BRDNail>_> *)
                                 in_stack_ffffffffffffec80,(value_type *)in_stack_ffffffffffffec78);
                      pbVar7 = local_d00;
                      break;
                    case 4:
                      break;
                    case 5:
                      break;
                    case 6:
                      break;
                    case 7:
                    }
                  }
                }
              }
              local_d00 = pbVar7;
              __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
              operator++(&local_ce8);
            }
            local_1030 = 2;
            while (uVar15 = local_1030,
                  sVar10 = std::vector<char_*,_std::allocator<char_*>_>::size(&local_cd0),
                  uVar15 < sVar10) {
              ppcVar11 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                                   (&local_cd0,local_1030);
              local_1038 = (byte *)*ppcVar11;
              while (iVar3 = isspace((uint)*local_1038), iVar3 != 0) {
                local_1038 = local_1038 + 1;
              }
              if ((*local_1038 != 0) && (local_1040 = local_1038, *local_1038 != 0x73)) {
                FZPartDesc::FZPartDesc((FZPartDesc *)0x182d83);
                local_10a0 = &local_1040;
                local_1098 = local_1048;
                local_1090 = &local_2f0;
                local_1088 = &local_2f8;
                local_1080 = parse::anon_class_32_4_fa413470::operator()
                                       ((anon_class_32_4_fa413470 *)
                                        CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70
                                                ));
                local_10c0 = &local_1040;
                local_10b8 = local_1048;
                local_10b0 = &local_2f0;
                local_10a8 = &local_2f8;
                local_1078 = parse::anon_class_32_4_fa413470::operator()
                                       ((anon_class_32_4_fa413470 *)
                                        CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70
                                                ));
                local_10e8.field_2._8_8_ = &local_1040;
                local_1070 = parse::anon_class_16_2_d7082a65::operator()(in_stack_ffffffffffffedc0);
                local_1129._1_8_ = &local_1040;
                local_1120 = local_1048;
                local_1118 = &local_2f0;
                local_1110 = &local_2f8;
                parse::anon_class_32_4_fa413470::operator()
                          ((anon_class_32_4_fa413470 *)
                           CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
                this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1129;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (this_01,(char *)in_stack_ffffffffffffeca8,
                           (allocator<char> *)in_stack_ffffffffffffeca0);
                split_string(in_stack_ffffffffffffee78);
                in_stack_ffffffffffffeca0 = &local_10e8;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffec80,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffec78);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffec80);
                std::__cxx11::string::~string(local_1108);
                std::allocator<char>::~allocator((allocator<char> *)local_1129);
                local_1150 = &local_1040;
                local_1148 = local_1048;
                local_1140 = &local_2f0;
                local_1138 = &local_2f8;
                in_stack_ffffffffffffeca8 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     parse::anon_class_32_4_fa413470::operator()
                               ((anon_class_32_4_fa413470 *)
                                CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
                local_1050 = in_stack_ffffffffffffeca8;
                std::vector<FZPartDesc,_std::allocator<FZPartDesc>_>::push_back
                          ((vector<FZPartDesc,_std::allocator<FZPartDesc>_> *)
                           in_stack_ffffffffffffec80,(value_type *)in_stack_ffffffffffffec78);
                FZPartDesc::~FZPartDesc((FZPartDesc *)0x182fe3);
              }
              local_1030 = local_1030 + 1;
            }
            local_1158 = in_RDI + 0x18;
            local_1160._M_current =
                 (FZPartDesc *)
                 std::vector<FZPartDesc,_std::allocator<FZPartDesc>_>::begin
                           ((vector<FZPartDesc,_std::allocator<FZPartDesc>_> *)
                            in_stack_ffffffffffffec68);
            local_1168 = (FZPartDesc *)
                         std::vector<FZPartDesc,_std::allocator<FZPartDesc>_>::end
                                   ((vector<FZPartDesc,_std::allocator<FZPartDesc>_> *)
                                    in_stack_ffffffffffffec68);
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<FZPartDesc_*,_std::vector<FZPartDesc,_std::allocator<FZPartDesc>_>_>
                                       *)CONCAT44(in_stack_ffffffffffffec74,
                                                  in_stack_ffffffffffffec70),
                                      (__normal_iterator<FZPartDesc_*,_std::vector<FZPartDesc,_std::allocator<FZPartDesc>_>_>
                                       *)in_stack_ffffffffffffec68), bVar2) {
              local_1170 = __gnu_cxx::
                           __normal_iterator<FZPartDesc_*,_std::vector<FZPartDesc,_std::allocator<FZPartDesc>_>_>
                           ::operator*(&local_1160);
              local_1178 = &local_1170->locations;
              local_1180._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_ffffffffffffec68);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffec68);
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)CONCAT44(in_stack_ffffffffffffec74,
                                                    in_stack_ffffffffffffec70),
                                        (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)in_stack_ffffffffffffec68), bVar2) {
                local_1190 = __gnu_cxx::
                             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*(&local_1180);
                local_1198._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)in_stack_ffffffffffffec68,(key_type *)0x183161);
                local_11a0._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            *)in_stack_ffffffffffffec68);
                bVar2 = std::__detail::operator!=(&local_1198,&local_11a0);
                if (bVar2) {
                  in_stack_ffffffffffffec80 = (BRDPart *)local_1170->description;
                  std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                  ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                *)0x1831d4);
                  pvVar14 = std::vector<BRDPart,_std::allocator<BRDPart>_>::at
                                      ((vector<BRDPart,_std::allocator<BRDPart>_> *)
                                       CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70)
                                       ,(size_type)in_stack_ffffffffffffec68);
                  std::__cxx11::string::operator=
                            ((string *)&pvVar14->mfgcode,(char *)in_stack_ffffffffffffec80);
                }
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_1180);
              }
              __gnu_cxx::
              __normal_iterator<FZPartDesc_*,_std::vector<FZPartDesc,_std::allocator<FZPartDesc>_>_>
              ::operator++(&local_1160);
            }
            __lhs = (array<unsigned_int,_44UL> *)0x0;
            while (fzkey_00 = __lhs,
                  paVar12 = (array<unsigned_int,_44UL> *)
                            std::vector<BRDPin,_std::allocator<BRDPin>_>::size
                                      ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc)),
                  __lhs < paVar12) {
              pvVar13 = std::vector<BRDPin,_std::allocator<BRDPin>_>::operator[]
                                  ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc),
                                   (size_type)fzkey_00);
              if (pvVar13->part != 0) {
                in_stack_ffffffffffffec74 = (uint)fzkey_00;
                this_00 = (vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9);
                pvVar13 = std::vector<BRDPin,_std::allocator<BRDPin>_>::operator[]
                                    ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc),
                                     (size_type)fzkey_00);
                pvVar14 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                                    (this_00,(ulong)(pvVar13->part - 1));
                pvVar14->end_of_pins = in_stack_ffffffffffffec74;
              }
              __lhs = (array<unsigned_int,_44UL> *)((long)fzkey_00->_M_elems + 1);
            }
            gen_outline(in_stack_ffffffffffffed40);
            update_counts((FZFile *)CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
            setlocale(1,local_28);
            *(bool *)(in_RDI + 0x12) = local_c64 != 0;
            if ((*(byte *)(in_RDI + 0x12) & 1) == 0) {
              fz_key_to_string<44ul>(fzkey_00);
              std::operator+((char *)__lhs,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70));
              std::__cxx11::string::operator+=((string *)(in_RDI + 0x13),local_11c8);
              std::__cxx11::string::~string(local_11c8);
              std::__cxx11::string::~string(local_11e8);
            }
            std::vector<char_*,_std::allocator<char_*>_>::~vector
                      ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffec80);
            std::vector<char_*,_std::allocator<char_*>_>::~vector
                      ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffec80);
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)0x183425);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FZFile::parse(std::vector<char> &buf, const std::array<uint32_t, 44> &fzkey) {
	auto buffer_size = buf.size();
	char *saved_locale;
	float multiplier = 1.0f;
	saved_locale     = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	if (check_fz_key(fzkey)) {
		key = fzkey;
	} else if (!check_fz_key(key)) { // Try to fallback to built-in key
		valid = false;
		error_msg = getKeyErrorMsg();
		error_msg += fz_key_to_string(fzkey);
		return;
	}

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	/*
	 * Some non-encrypted, but zip-encoded files are popping up now and then.
	 *
	 * Thanks to piernov for noticing the starting byte sequence
	 *
	 * Attempt to decode using the decode() call and subsequently
	 * split the file to get the content.  If that fails, then try again
	 * without decoding.
	 */

	uint8_t s1 = file_buf[4];
	uint8_t s2 = file_buf[5];
	if (!((s1 == 0x78) && ((s2 == 0x9C) || (s2 == 0xDA)))) {

		/*
		 * Doesn't have the zlib signature, so decode it first.
		 *
		 * 1 in ~2^16 chance of a false hit.
		 */
		FZFile::decode(file_buf, buffer_size); // RC6 decryption
		                                       // fprintf(stderr,"FZFile:Decoded\n");
	}

	size_t content_size = 0;
	size_t descr_size   = 0;
	char *descr;
	char *content = FZFile::split(file_buf, buffer_size, content_size, descr, descr_size); // then split it

	/*
  if (!content) {
	 // Decryption must have failed, so try again now without decrypting the data
	std::copy(buf.begin(), buf.end(), file_buf);
	content = FZFile::split(file_buf, buffer_size, content_size, descr, descr_size); // then split it
  }
  */

	ENSURE_OR_FAIL(content != nullptr, error_msg, return);
	ENSURE_OR_FAIL(content_size > 0, error_msg, return);
	content = FZFile::decompress(content, content_size, content_size); // decompress zlib content data
	ENSURE_OR_FAIL(content != nullptr, error_msg, return);
	ENSURE_OR_FAIL(content_size > 0, error_msg, return);

	ENSURE_OR_FAIL(content != descr, error_msg, return);
	ENSURE_OR_FAIL(descr_size > 0, error_msg, return);
	descr = FZFile::decompress(descr, descr_size, descr_size);
	ENSURE_OR_FAIL(descr != nullptr, error_msg, return);
	ENSURE_OR_FAIL(descr_size > 0, error_msg, return);

	int current_block = 0;
	std::unordered_map<std::string, int> parts_id; // map between part name and part number

	std::vector<char *> lines_content;
	stringfile(content, lines_content);

	std::vector<char *> lines_descr;
	stringfile(descr, lines_descr);

	// For some reason, some boards have COMMAs as decimal separators. Will wonders ever cease ( I realise this is a regional thing
	// )?
	std::replace(content, content + content_size, ',', '.');

	// Parse the content part (parts, pins, nails)

	for (char *line : lines_content) {
		//	fprintf(stdout,"%s\n", line);

		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		/*
		 * If we have a UNIT: line in the data, see if it's requesting millimeters and scale appropriatley.
		 * Default is units are thou (0.001")
		 */
		if (!strcmp(line, "UNIT:millimeters")) {
			multiplier = 25.4f;
		}

		if (line[0] == 'A') { // New block
			line += 2;        // skip "A!"
			if (!strncmp(line, "REFDES", 6)) {
				current_block = 1;
			} else if (!strncmp(line, "NET_NAME", 8)) {
				current_block = 2;
			} else if (!strncmp(line, "TESTVIA", 7)) {
				current_block = 3;
			} else if (!strncmp(line, "GRAPHIC_DATA_NAME", 17)) {
				current_block = 4;
			} else if (!strncmp(line, "CLASS", 5)) {
				current_block = 5;
			} else if (!strncmp(line, "LOGOInfo", 8)) {
				current_block = 6;
			} else if (!strncmp(line, "UnDrawSym", 9)) {
				current_block = 7;
			} else {
				current_block = -1;
			}
			continue;
		} else if (line[0] != 'S') // Unknown line type
			continue;              // jump to next line
		else
			p += 2; // Skip "S!"

		switch (current_block) {
			case 1: { // Parts
				BRDPart part;
				part.name = READ_STR();
				/*char *cic =*/READ_STR();
				/*char *sname =*/READ_STR();
				char *smirror = READ_STR();
				/*char *srotate =*/READ_STR();
				part.part_type = BRDPartType::SMD;
				if (!strcmp(smirror, "YES"))
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
				part.end_of_pins       = 0;
				parts.push_back(part);
				parts_id[part.name] = parts.size();
			} break;
			case 2: { // Pins
				/* There are more then single FZ file variant even if all those files ahre same header looking like
				A!NET_NAME!REFDES!PIN_NUMBER!PIN_NAME!PIN_X!PIN_Y!TEST_POINT!RADIUS!

				There are at least 2 variants, placing BGA pin label in different places:
				S!SATA_GP1!SU1!AJ43!GPP_E1/SATAXPCIE1/SATAGP1!3315.86!1830.70!!6!
				S!SNN_FBA_WCKB45*!G1!0!AJ31!3140.51!1436.167!!7.48106!

				For first variant the PIN_NAME column is ignored until thre would be a filed for handling/displaying such info
				But for second varinat the PIN_NUMBER column is always the "0" literal, so PIN_NAME is used as name.
				*/
				BRDPin pin;
				pin.net    = READ_STR();
				char *part = READ_STR();
				pin.part   = parts_id.at(part);
				pin.snum   = READ_STR();
				char *name = READ_STR();

				// use name field as pin name if snum is empty string or "0" (decimal zero as string)
				bool name_is_pin_position_id = strlen(pin.snum) <= 1 && (pin.snum[0] == '\0' or pin.snum[0] == '0');
				if (name_is_pin_position_id)
				{
					pin.name = name;
				}
				double posx   = READ_DOUBLE();
				pin.pos.x     = posx * multiplier;
				double posy   = READ_DOUBLE();
				pin.pos.y     = posy * multiplier;
				pin.probe     = READ_UINT();
				double radius = READ_DOUBLE();
				radius /= 100;
				if (radius < 0.5f) radius = 0.5f;
				pin.radius                = radius * multiplier;
				switch (parts[pin.part - 1].mounting_side) {
					case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
					case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
					case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
				}
				pins.push_back(pin);
			} break;
			case 3: {   // Nails
				p += 2; // Skip "Y!"
				BRDNail nail;
				nail.net = READ_STR();
				/*char *refdes =*/READ_STR();
				/*int pinnumber =*/READ_INT(); // uint
				/*char *pinname =*/READ_STR();

				double posx = READ_DOUBLE();
				nail.pos.x  = posx * multiplier;
				double posy = READ_DOUBLE();
				nail.pos.y  = posy * multiplier;
				char *loc   = READ_STR();
				if (!strcmp(loc, "T"))
					nail.side = BRDPartMountingSide::Top;
				else
					nail.side = BRDPartMountingSide::Bottom;
				/*double radius =*/READ_DOUBLE();
				nails.push_back(nail);
			} break;
			case 4: { // Drawing
			} break;
			case 5: { // Unknown
			} break;
			case 6: { // Logo/Info
			} break;
			case 7: { // Unknown
			} break;
		}
	}

	// Parse the descr part (parts info)
	// Note: Discard first 2 lines (board description, currently unused and table columns name)
	for (size_t i = 2; i < lines_descr.size(); ++i) {
		char *line = lines_descr[i];

		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		if (line[0] == 's') continue; // PARTNUMBER starting with 's' seems unused

		FZPartDesc pdesc;
		pdesc.partno      = READ_DESCR_STR();
		pdesc.description = READ_DESCR_STR();
		pdesc.quantity    = READ_DESCR_UINT();
		pdesc.locations   = split_string(READ_DESCR_STR());
		pdesc.partno2     = READ_DESCR_STR();
		partsDesc.push_back(pdesc);
	}

	for (auto &pdesc : partsDesc) {
		for (auto &partname : pdesc.locations) {
			auto iter = parts_id.find(partname);
			if (iter != parts_id.end()) { // Sometimes the desc part references stuff not in content part, ignore it
				parts.at(iter->second - 1).mfgcode = pdesc.description;
			}
		}
	}

	//	std::sort(pins.begin(), pins.end()); // sort vector by part num then pin num
	for (std::vector<int>::size_type i = 0; i < pins.size(); i++) {
		// update end_of_pins field
		if (pins[i].part > 0) parts[pins[i].part - 1].end_of_pins = i;
	}

	gen_outline();

	update_counts();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = current_block != 0;

	if (!valid) {
		error_msg += "FZ Key:\n" + fz_key_to_string(key);
	}
}